

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdjacencyTree.hpp
# Opt level: O2

AdjSplayVertex * __thiscall
konig::AdjacencyTree::_lower_bound(AdjacencyTree *this,adjacency_t adjacency)

{
  adjacency_t aVar1;
  bool bVar2;
  AdjSplayVertex *vertex;
  undefined7 extraout_var;
  long lVar3;
  AdjSplayVertex *pAVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  adjacency_t adjacency_local;
  
  adjacency_local = adjacency;
  vertex = root(this);
  pAVar4 = (AdjSplayVertex *)0x0;
  for (; vertex != (AdjSplayVertex *)0x0;
      vertex = *(AdjSplayVertex **)((long)&vertex->parent + lVar3)) {
    bVar2 = std::operator>=(&vertex->adjacency,&adjacency_local);
    lVar3 = 0x10;
    if ((bVar2) &&
       (aVar1 = vertex->adjacency, iVar6 = -(uint)(adjacency_local.first == aVar1.first),
       iVar7 = -(uint)(adjacency_local.second == aVar1.second), auVar5._4_4_ = iVar6,
       auVar5._0_4_ = iVar6, auVar5._8_4_ = iVar7, auVar5._12_4_ = iVar7,
       iVar6 = movmskpd((int)CONCAT71(extraout_var,bVar2),auVar5), lVar3 = 8, pAVar4 = vertex,
       iVar6 == 3)) goto LAB_00146a37;
  }
  vertex = pAVar4;
  if (pAVar4 == (AdjSplayVertex *)0x0) {
    vertex = (AdjSplayVertex *)0x0;
  }
  else {
LAB_00146a37:
    splay(this,vertex);
  }
  return vertex;
}

Assistant:

AdjSplayVertex* _lower_bound(adjacency_t adjacency) noexcept {
            AdjSplayVertex* vertex = root();
            AdjSplayVertex* cut_point = NULL;

            while (vertex) {
                if (vertex->adjacency >= adjacency) {
                    cut_point = vertex;

                    if (vertex->adjacency == adjacency) // There are no duplicates in this structure
                        break;
                    else
                        vertex = vertex->left_child;
                } else {
                    vertex = vertex->right_child;
                }
            }

            if (cut_point)
                splay(cut_point);
            return cut_point;
        }